

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_dependencies.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBDependenciesInit(ClientContext *context,TableFunctionInitInput *input)

{
  int iVar1;
  Catalog *pCVar2;
  undefined4 extraout_var;
  DependencyManager *this;
  optional_ptr<duckdb::DependencyManager,_true> dependency_manager;
  optional_ptr<duckdb::DependencyManager,_true> local_50;
  element_type *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  make_uniq<duckdb::DuckDBDependenciesData>();
  ::std::__cxx11::string::string
            ((string *)local_40._M_pod_data,anon_var_dwarf_3b6586a + 9,(allocator *)&local_50);
  pCVar2 = Catalog::GetCatalog((ClientContext *)input,(string *)&local_40);
  ::std::__cxx11::string::~string((string *)local_40._M_pod_data);
  iVar1 = (*pCVar2->_vptr_Catalog[0x1a])(pCVar2);
  local_50.ptr = (DependencyManager *)CONCAT44(extraout_var,iVar1);
  if (local_50.ptr != (DependencyManager *)0x0) {
    this = optional_ptr<duckdb::DependencyManager,_true>::operator->(&local_50);
    local_40._8_8_ = 0;
    local_28 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_dependencies.cpp:63:16)>
               ::_M_invoke;
    local_30 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/function/table/system/duckdb_dependencies.cpp:63:16)>
               ::_M_manager;
    local_40._M_unused._M_object = &local_48;
    DependencyManager::Scan
              (this,(ClientContext *)input,
               (function<void_(duckdb::CatalogEntry_&,_duckdb::CatalogEntry_&,_const_duckdb::DependencyDependentFlags_&)>
                *)&local_40);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBDependenciesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBDependenciesData>();

	// scan all the schemas and collect them
	auto &catalog = Catalog::GetCatalog(context, INVALID_CATALOG);
	auto dependency_manager = catalog.GetDependencyManager();
	if (dependency_manager) {
		dependency_manager->Scan(
		    context, [&](CatalogEntry &obj, CatalogEntry &dependent, const DependencyDependentFlags &flags) {
			    result->entries.emplace_back(obj, dependent, flags);
		    });
	}

	return std::move(result);
}